

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void rd_4dim(char **content,size_t *line_no,int *array,int *dim,int *shift)

{
  int post [4];
  int local_18 [6];
  
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  rd_4dim_slice(content,line_no,array,int11_dim,int11_shift,local_18);
  return;
}

Assistant:

PRIVATE void
rd_4dim(char    **content,
        size_t  *line_no,
        int     *array,
        int     dim[4],
        int     shift[4])
{
  int post[4] = {
    0, 0, 0, 0
  };

  rd_4dim_slice(content, line_no, array,
                dim,
                shift,
                post);
}